

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-store.c
# Opt level: O0

void textui_store_knowledge(store *store)

{
  undefined1 local_118 [8];
  store_context ctx;
  store *store_local;
  
  ctx.scr_places_y._24_8_ = store;
  screen_save();
  clear_from(L'\0');
  if (ctx.scr_places_y._24_8_ == 0) {
    prt("You have no home!",L'\x0f',L'\0');
    anykey();
    screen_load();
  }
  else {
    store_menu_init((store_context *)local_118,(store *)ctx.scr_places_y._24_8_,true);
    menu_select((menu_conflict *)local_118,0,false);
    event_signal(EVENT_MESSAGE_FLUSH);
    screen_load();
    mem_free(ctx.store);
  }
  return;
}

Assistant:

void textui_store_knowledge(struct store *store)
{
	struct store_context ctx;

	screen_save();
	clear_from(0);

	if (!store) {
		prt("You have no home!", 15, 0);
		anykey();
		screen_load();
		return;
	}

	store_menu_init(&ctx, store, true);
	menu_select(&ctx.menu, 0, false);

	/* Flush messages XXX XXX XXX */
	event_signal(EVENT_MESSAGE_FLUSH);

	screen_load();

	mem_free(ctx.list);
}